

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::eval_div_vec3(ShaderEvalContext *c)

{
  VecAccess<float,_4,_3> local_50;
  undefined1 local_34 [12];
  undefined1 local_28 [12];
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_28,(int)c + 0x30,2,0);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_34,(int)local_10 + 0x40,1,2);
  tcu::div<float,3>((tcu *)&local_1c,(Vector<float,_3> *)local_28,(Vector<float,_3> *)local_34);
  tcu::Vector<float,_4>::xyz(&local_50,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_50,&local_1c);
  return;
}

Assistant:

void eval_selection_float	(ShaderEvalContext& c) { c.color.x()	= selection(c.in[0].z() > 0.0f,		c.in[1].x(),					c.in[2].y()); }